

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.hpp
# Opt level: O0

void __thiscall lightconf::writer::newline(writer *this)

{
  int iVar1;
  reference pvVar2;
  allocator local_69;
  string local_68;
  allocator local_31;
  string local_30;
  writer *local_10;
  writer *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"\n",&local_31);
  append(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  pvVar2 = std::stack<int,_std::deque<int,_std::allocator<int>_>_>::top(&this->tabstops);
  iVar1 = *pvVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,(long)iVar1,' ',&local_69);
  append(this,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  this->line = this->line + 1;
  pvVar2 = std::stack<int,_std::deque<int,_std::allocator<int>_>_>::top(&this->tabstops);
  this->col = *pvVar2;
  return;
}

Assistant:

void writer::newline() {
    append("\n");
    append(std::string(tabstops.top(), ' '));
    line++;
    col = tabstops.top();
}